

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O3

void __thiscall nite::Batch::unload(Batch *this)

{
  pointer ppBVar1;
  bool bVar2;
  pointer pBVar3;
  pointer pBVar4;
  int iVar5;
  long lVar6;
  pointer ppBVar7;
  pointer __src;
  ulong uVar8;
  ulong uVar9;
  
  clearBuffer(this);
  pBVar3 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = this->objectId;
  lVar6 = (long)iVar5;
  if ((-1 < lVar6) &&
     (batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
      _M_start)) {
    ppBVar1 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6].owners.
              super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar7 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6].owners.
              super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pBVar4 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)ppBVar7 - (long)ppBVar1 != 0) {
      uVar8 = 0;
      uVar9 = 1;
      do {
        if (ppBVar1[uVar8] == this) {
          __src = ppBVar1 + uVar8 + 1;
          if (__src != ppBVar7) {
            memmove(ppBVar1 + uVar8,__src,(long)ppBVar7 - (long)__src);
            ppBVar7 = pBVar3[lVar6].owners.
                      super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            iVar5 = this->objectId;
          }
          pBVar4 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pBVar3[lVar6].owners.super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppBVar7 + -1;
          break;
        }
        bVar2 = uVar9 < (ulong)((long)ppBVar7 - (long)ppBVar1 >> 3);
        uVar8 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar2);
    }
    if (pBVar4[iVar5].owners.super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        pBVar4[iVar5].owners.super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      BatchT::clear(pBVar4 + iVar5);
    }
    this->objectId = -1;
  }
  return;
}

Assistant:

void nite::Batch::unload(){	
	clearBuffer();	
	if (objectId <= -1 || batches.size() == 0) return;
	for(unsigned i=0; i<batches[objectId].owners.size(); i++){
		if (batches[objectId].owners[i] == this){
			batches[objectId].owners.erase(batches[objectId].owners.begin()+i);
			break;
		}
	}
	if (batches[objectId].owners.size() == 0){
		batches[objectId].clear();
	}
  	objectId = -1;	
}